

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

bool amrex::is_integer(char *str)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  int i;
  int len;
  int local_18;
  
  if (in_RDI != (char *)0x0) {
    sVar2 = strlen(in_RDI);
    if ((int)sVar2 != 0) {
      local_18 = 0;
      while( true ) {
        if ((int)sVar2 <= local_18) {
          return true;
        }
        iVar1 = isdigit((int)in_RDI[local_18]);
        if (iVar1 == 0) break;
        local_18 = local_18 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool
amrex::is_integer (const char* str)
{
    int len = 0;

    if (str == 0 || (len = strlen(str)) == 0)
        return false;

    for (int i = 0; i < len; i++)
        if (!isdigit(str[i]))
            return false;

    return true;
}